

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O1

void __thiscall Node::Node(Node *this,Node *OldNode)

{
  Node *pNVar1;
  Node *pNVar2;
  long lVar3;
  
  (this->TextValue)._M_dataplus._M_p = (pointer)&(this->TextValue).field_2;
  (this->TextValue)._M_string_length = 0;
  (this->TextValue).field_2._M_local_buf[0] = '\0';
  this->Type = OldNode->Type;
  std::__cxx11::string::_M_assign((string *)&this->TextValue);
  this->FromInclude = OldNode->FromInclude;
  this->lineno = OldNode->lineno;
  lVar3 = 0;
  do {
    pNVar1 = OldNode->Tree[lVar3];
    if (pNVar1 == (Node *)0x0) {
      pNVar2 = (Node *)0x0;
    }
    else {
      pNVar2 = (Node *)operator_new(0x70);
      Node(pNVar2,pNVar1);
    }
    this->Tree[lVar3] = pNVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 0;
  do {
    pNVar1 = OldNode->Block[lVar3];
    if (pNVar1 == (Node *)0x0) {
      pNVar2 = (Node *)0x0;
    }
    else {
      pNVar2 = (Node *)operator_new(0x70);
      Node(pNVar2,pNVar1);
    }
    this->Block[lVar3] = pNVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

Node::Node(
	const Node &OldNode	/**< Node to copy */
)
{
	int loop;		// Generic loop variable

	//
	// Copy over all the easy bits
	//
	Type = OldNode.Type;
	TextValue = OldNode.TextValue;
	Level = OldNode.Level;
	FromInclude = OldNode.FromInclude;
	lineno = OldNode.lineno;

	//
	// Copy over tree entries
	//
	for (loop = 0; loop < 5; loop++)
	{
		if (OldNode.Tree[loop] == 0)
		{
			Tree[loop] = 0;
		}
		else
		{
			//
			// Recursive call here
			//
			Tree[loop] = new Node(*OldNode.Tree[loop]);
		}
	}

	//
	// Copy over block entries
	//
	//	Should we really copy over the block entries?
	//	This may proove to be rather a lot of stuff.
	//
	for (loop = 0; loop < 3; loop++)
	{
		if (OldNode.Block[loop] == 0)
		{
			Block[loop] = 0;
		}
		else
		{
			//
			// Recursive call here
			//
			Block[loop] = new Node(*OldNode.Block[loop]);
		}
	}
}